

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::inspectActiveSubroutineUniformName
          (FunctionalTest3_4 *this,GLuint program_id,GLchar **uniform_names)

{
  ostringstream *this_00;
  pointer __s2;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  ulong uVar3;
  long lVar4;
  GLint n_active_subroutine_uniforms;
  vector<char,_std::allocator<char>_> active_uniform_name;
  _Vector_base<char,_std::allocator<char>_> local_1e8;
  ulong local_1c8;
  long local_1c0;
  FunctionalTest3_4 *local_1b8;
  undefined1 local_1b0 [384];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  local_1e8._M_impl.super__Vector_impl_data._M_start = (char *)0x0;
  local_1e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(lVar4 + 0x9d0))(program_id,0x8b31,0x8de6);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"GetProgramStageiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xdc5);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)&local_1e8,
             (long)(this->m_n_active_subroutine_uniform_name_length + 1));
  uVar3 = 0;
  local_1c0 = lVar4;
  local_1b8 = this;
  do {
    lVar4 = local_1c0;
    if (-1 < (int)uVar3) {
LAB_00a14130:
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_1e8);
      return -1 < (int)uVar3;
    }
    local_1c8 = uVar3;
    (**(code **)(local_1c0 + 0x740))
              (program_id,0x8b31,uVar3,
               (int)local_1e8._M_impl.super__Vector_impl_data._M_finish -
               (int)local_1e8._M_impl.super__Vector_impl_data._M_start,0);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"GetActiveSubroutineUniformName",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0xdcf);
    __s2 = local_1e8._M_impl.super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      if (lVar4 == 0) {
        local_1b0._0_8_ = ((local_1b8->super_TestCase).m_context)->m_testCtx->m_log;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,
                        "Error. Invalid result. Function: getActiveSubroutineUniformName. idnex: ");
        uVar3 = local_1c8;
        std::ostream::operator<<(this_00,(int)local_1c8);
        std::operator<<((ostream *)this_00,". Result: ");
        std::operator<<((ostream *)this_00,local_1e8._M_impl.super__Vector_impl_data._M_start);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        goto LAB_00a14130;
      }
      iVar1 = strcmp(uniform_names[lVar4],__s2);
      lVar4 = lVar4 + 1;
    } while (iVar1 != 0);
    uVar3 = (ulong)((int)local_1c8 + 1);
  } while( true );
}

Assistant:

bool FunctionalTest3_4::inspectActiveSubroutineUniformName(GLuint program_id, const GLchar** uniform_names) const
{
	const glw::Functions& gl						   = m_context.getRenderContext().getFunctions();
	bool				  result					   = true;
	GLint				  n_active_subroutine_uniforms = 0;
	std::vector<GLchar>   active_uniform_name;

	gl.getProgramStageiv(program_id, GL_VERTEX_SHADER, GL_ACTIVE_SUBROUTINE_UNIFORMS, &n_active_subroutine_uniforms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramStageiv");

	active_uniform_name.resize(m_n_active_subroutine_uniform_name_length + 1);

	for (GLint uniform = 0; uniform < n_active_subroutine_uniforms; ++uniform)
	{
		bool is_name_ok = false;

		gl.getActiveSubroutineUniformName(program_id, GL_VERTEX_SHADER, uniform, (GLsizei)active_uniform_name.size(),
										  0 /* length */, &active_uniform_name[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveSubroutineUniformName");

		for (GLint name = 0; name < n_active_subroutine_uniforms; ++name)
		{
			if (0 == strcmp(uniform_names[name], &active_uniform_name[0]))
			{
				is_name_ok = true;
				break;
			}
		}

		if (false == is_name_ok)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "Error. Invalid result. Function: getActiveSubroutineUniformName. idnex: " << uniform
				<< ". Result: " << &active_uniform_name[0] << tcu::TestLog::EndMessage;

			result = false;
			break;
		}
	}

	return result;
}